

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

void __thiscall
llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::~Expected
          (Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *this)

{
  long *__ptr_00;
  pointer *__ptr;
  
  __ptr_00 = *(long **)&this->field_0;
  if ((this->field_0x30 & 1) == 0) {
    if (__ptr_00 != (long *)((long)&this->field_0 + 0x10)) {
      free(__ptr_00);
      return;
    }
  }
  else {
    if (__ptr_00 != (long *)0x0) {
      (**(code **)(*__ptr_00 + 8))();
    }
    *(undefined8 *)(this->field_0).ErrorStorage.buffer = 0;
  }
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }